

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O3

void __thiscall mjs::reference::reference(reference *this,object_ptr *base,string *property_name)

{
  gc_heap *pgVar1;
  
  pgVar1 = (base->super_gc_heap_ptr_untyped).heap_;
  (this->base_).super_gc_heap_ptr_untyped.heap_ = pgVar1;
  (this->base_).super_gc_heap_ptr_untyped.pos_ = (base->super_gc_heap_ptr_untyped).pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)this);
  }
  pgVar1 = (property_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  (this->property_name_).super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar1;
  (this->property_name_).super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       (property_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  if (pgVar1 != (gc_heap *)0x0) {
    gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&this->property_name_);
  }
  return;
}

Assistant:

explicit reference(const object_ptr& base, const string& property_name) : base_(base), property_name_(property_name) {
    }